

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O0

int eckey_verify_wrap(void *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hash_len,uchar *sig,
                     size_t sig_len)

{
  undefined1 local_198 [8];
  mbedtls_ecdsa_context ecdsa;
  int ret;
  size_t sig_len_local;
  uchar *sig_local;
  size_t hash_len_local;
  uchar *hash_local;
  mbedtls_md_type_t md_alg_local;
  void *ctx_local;
  
  ecdsa.Q.Z.p._4_4_ = 0xffffff92;
  mbedtls_ecdsa_init((mbedtls_ecdsa_context *)local_198);
  ecdsa.Q.Z.p._4_4_ =
       mbedtls_ecdsa_from_keypair((mbedtls_ecdsa_context *)local_198,(mbedtls_ecp_keypair *)ctx);
  if (ecdsa.Q.Z.p._4_4_ == 0) {
    ecdsa.Q.Z.p._4_4_ = ecdsa_verify_wrap(local_198,md_alg,hash,hash_len,sig,sig_len);
  }
  mbedtls_ecdsa_free((mbedtls_ecdsa_context *)local_198);
  return ecdsa.Q.Z.p._4_4_;
}

Assistant:

static int eckey_verify_wrap( void *ctx, mbedtls_md_type_t md_alg,
                       const unsigned char *hash, size_t hash_len,
                       const unsigned char *sig, size_t sig_len )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecdsa_context ecdsa;

    mbedtls_ecdsa_init( &ecdsa );

    if( ( ret = mbedtls_ecdsa_from_keypair( &ecdsa, ctx ) ) == 0 )
        ret = ecdsa_verify_wrap( &ecdsa, md_alg, hash, hash_len, sig, sig_len );

    mbedtls_ecdsa_free( &ecdsa );

    return( ret );
}